

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O2

int __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::open
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this,char *__file,
          int __oflag,...)

{
  int extraout_EAX;
  error_code ec;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  detail::reactive_socket_service<asio::ip::tcp>::open
            ((this->impl_).service_,(char *)&(this->impl_).implementation_,(int)__file,&local_28);
  detail::throw_error(&local_28,"open");
  return extraout_EAX;
}

Assistant:

void open(const protocol_type& protocol = protocol_type())
  {
    asio::error_code ec;
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
  }